

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cc
# Opt level: O2

pid_t absl::lts_20250127::base_internal::GetCachedTID(void)

{
  pid_t pVar1;
  long in_FS_OFFSET;
  
  if (*(char *)(in_FS_OFFSET + -0x18) != '\x01') {
    pVar1 = GetTID();
    *(pid_t *)(in_FS_OFFSET + -0x1c) = pVar1;
    *(undefined1 *)(in_FS_OFFSET + -0x18) = 1;
  }
  return *(pid_t *)(in_FS_OFFSET + -0x1c);
}

Assistant:

pid_t GetCachedTID() {
#ifdef ABSL_HAVE_THREAD_LOCAL
  static thread_local pid_t thread_id = GetTID();
  return thread_id;
#else
  return GetTID();
#endif  // ABSL_HAVE_THREAD_LOCAL
}